

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

mp_int * mp_nthroot(mp_int *y,uint n,mp_int *remainder_out)

{
  uint which;
  undefined8 *ptr;
  mp_int *pmVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  size_t i;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong factor1;
  bool bVar9;
  long local_70;
  
  uVar8 = (ulong)n;
  factor1 = (ulong)(n * 2 + 3);
  ptr = (undefined8 *)safemalloc(factor1,8,0);
  for (uVar6 = 0; factor1 != uVar6; uVar6 = uVar6 + 1) {
    pmVar1 = mp_make_sized(y->nw + 1);
    ptr[uVar6] = pmVar1;
  }
  uVar6 = (ulong)(n + 1);
  pmVar1 = (mp_int *)ptr[n * 2 + 2];
  mp_copy_integer_into((mp_int *)*ptr,1);
  local_70 = (y->nw << 6) / uVar8 + 1;
  do {
    bVar9 = local_70 == 0;
    local_70 = local_70 + -1;
    if (bVar9) {
      if (remainder_out != (mp_int *)0x0) {
        mp_sub_into(remainder_out,y,(mp_int *)ptr[uVar8]);
      }
      pmVar1 = mp_new((y->nw << 6) / uVar8);
      mp_copy_into(pmVar1,(mp_int *)ptr[1]);
      for (uVar8 = 0; factor1 != uVar8; uVar8 = uVar8 + 1) {
        mp_free((mp_int *)ptr[uVar8]);
      }
      safefree(ptr);
      return pmVar1;
    }
    for (uVar3 = 0; uVar3 != uVar6; uVar3 = uVar3 + 1) {
      mp_copy_into((mp_int *)ptr[uVar6 + uVar3],(mp_int *)ptr[uVar3]);
      uVar2 = 1;
      uVar4 = 1;
      lVar5 = 0;
      uVar7 = uVar3;
      while (uVar7 != 0) {
        mp_mul_integer_into(pmVar1,(mp_int *)ptr[uVar4 - 1],(uint16_t)uVar2);
        mp_lshift_fixed_into(pmVar1,pmVar1,(uVar3 - lVar5) * local_70);
        mp_add_into_internal((mp_int *)ptr[uVar6 + uVar3],(mp_int *)ptr[uVar6 + uVar3],pmVar1);
        lVar5 = lVar5 + 1;
        uVar2 = ((int)uVar7 * ((uint)uVar2 & 0xffff)) / uVar4;
        uVar4 = uVar4 + 1;
        uVar7 = uVar7 - 1;
        if (0xffff < uVar2) {
          __assert_fail("binom_mul < 0x10000",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c"
                        ,0x9ac,"mp_int *mp_nthroot(mp_int *, unsigned int, mp_int *)");
        }
      }
    }
    which = mp_cmp_hs(y,(mp_int *)ptr[uVar6 + uVar8]);
    for (lVar5 = 0; uVar6 * 8 != lVar5; lVar5 = lVar5 + 8) {
      mp_select_into(*(mp_int **)((long)ptr + lVar5),*(mp_int **)((long)ptr + lVar5),
                     *(mp_int **)((long)ptr + lVar5 + uVar6 * 8),which);
    }
  } while( true );
}

Assistant:

mp_int *mp_nthroot(mp_int *y, unsigned n, mp_int *remainder_out)
{
    /*
     * Allocate scratch space.
     */
    mp_int **alloc, **powers, **newpowers, *scratch;
    size_t nalloc = 2*(n+1)+1;
    alloc = snewn(nalloc, mp_int *);
    for (size_t i = 0; i < nalloc; i++)
        alloc[i] = mp_make_sized(y->nw + 1);
    powers = alloc;
    newpowers = alloc + (n+1);
    scratch = alloc[2*n+2];

    /*
     * We're computing the rounded-down nth root of y, i.e. the
     * maximal x such that x^n <= y. We try to add 2^i to it for each
     * possible value of i, starting from the largest one that might
     * fit (i.e. such that 2^{n*i} fits in the size of y) downwards to
     * i=0.
     *
     * We track all the smaller powers of x in the array 'powers'. In
     * each iteration, if we update x, we update all of those values
     * to match.
     */
    mp_copy_integer_into(powers[0], 1);
    for (size_t s = mp_max_bits(y) / n + 1; s-- > 0 ;) {
        /*
         * Let b = 2^s. We need to compute the powers (x+b)^i for each
         * i, starting from our recorded values of x^i.
         */
        for (size_t i = 0; i < n+1; i++) {
            /*
             * (x+b)^i = x^i
             *         + (i choose 1) x^{i-1} b
             *         + (i choose 2) x^{i-2} b^2
             *         + ...
             *         + b^i
             */
            uint16_t binom = 1;       /* coefficient of b^i */
            mp_copy_into(newpowers[i], powers[i]);
            for (size_t j = 0; j < i; j++) {
                /* newpowers[i] += binom * powers[j] * 2^{(i-j)*s} */
                mp_mul_integer_into(scratch, powers[j], binom);
                mp_lshift_fixed_into(scratch, scratch, (i-j) * s);
                mp_add_into(newpowers[i], newpowers[i], scratch);

                uint32_t binom_mul = binom;
                binom_mul *= (i-j);
                binom_mul /= (j+1);
                assert(binom_mul < 0x10000);
                binom = binom_mul;
            }
        }

        /*
         * Now, is the new value of x^n still <= y? If so, update.
         */
        unsigned newbit = mp_cmp_hs(y, newpowers[n]);
        for (size_t i = 0; i < n+1; i++)
            mp_select_into(powers[i], powers[i], newpowers[i], newbit);
    }

    if (remainder_out)
        mp_sub_into(remainder_out, y, powers[n]);

    mp_int *root = mp_new(mp_max_bits(y) / n);
    mp_copy_into(root, powers[1]);

    for (size_t i = 0; i < nalloc; i++)
        mp_free(alloc[i]);
    sfree(alloc);

    return root;
}